

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Statement * routineStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  TokenType TVar1;
  Token t;
  Token t_00;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char **__ptr;
  int iVar5;
  size_t __size;
  Block BVar6;
  Token local_90;
  Token local_70;
  Token local_50;
  
  __return_storage_ptr__->type = STATEMENT_ROUTINE;
  TVar1 = (head->value).line;
  (__return_storage_ptr__->field_1).breakStatement.pos.type = TVar1;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
  (__return_storage_ptr__->field_1).routine.isNative = 0;
  if (0 < compiler->indentLevel) {
    printf("\x1b[31m\n[Error] [Line:%d] Routines can only be declared in top level indent!\x1b[0m",
           (ulong)TVar1);
    he = he + 1;
  }
  iVar2 = match(TOKEN_FOREIGN);
  if (iVar2 != 0) {
    (__return_storage_ptr__->field_1).routine.isNative = 1;
  }
  consume(&local_50,TOKEN_IDENTIFIER,"Expected routine name!");
  t.start = local_50.start;
  t.type = local_50.type;
  t._4_4_ = local_50._4_4_;
  t.file = local_50.file;
  t.length = local_50.length;
  t.line = local_50.line;
  pcVar4 = stringOf(t);
  (__return_storage_ptr__->field_1).routine.name = pcVar4;
  iVar5 = 0;
  consume(&local_90,TOKEN_LEFT_PAREN,"Expected \'(\' after routine declaration!");
  if ((head == (TokenList *)0x0) || ((head->value).type != TOKEN_RIGHT_PAREN)) {
    __size = 8;
    __ptr = (char **)0x0;
    do {
      __ptr = (char **)realloc(__ptr,__size);
      consume(&local_70,TOKEN_IDENTIFIER,"Expected identifer as argument!");
      t_00.start = local_70.start;
      t_00.type = local_70.type;
      t_00._4_4_ = local_70._4_4_;
      t_00.file = local_70.file;
      t_00.length = local_70.length;
      t_00.line = local_70.line;
      pcVar4 = stringOf(t_00);
      *(char **)((long)__ptr + (__size - 8)) = pcVar4;
      iVar3 = match(TOKEN_COMMA);
      iVar5 = iVar5 + 1;
      __size = __size + 8;
    } while (iVar3 != 0);
    *(int *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = iVar5;
    (__return_storage_ptr__->field_1).routine.arguments = __ptr;
    consume(&local_90,TOKEN_RIGHT_PAREN,"Expected \')\' after argument declaration!");
  }
  else if (head->next != (TokenList *)0x0) {
    head = head->next;
  }
  consume(&local_90,TOKEN_NEWLINE,"Expected newline after routine declaration!");
  if (iVar2 == 0) {
    BVar6 = blockStatement(compiler,BLOCK_FUNC);
    *(Block *)&(__return_storage_ptr__->field_1).ifStatement.elseBranch.statements = BVar6;
    consume(&local_90,TOKEN_ENDROUTINE,"Expected EndRoutine after routine definition!");
    consume(&local_90,TOKEN_NEWLINE,"Expected newline after routine definition!");
  }
  return __return_storage_ptr__;
}

Assistant:

static Statement routineStatement(Compiler *compiler){
    Statement s;
    s.type = STATEMENT_ROUTINE;
    s.routine.line = presentLine();
    s.routine.arity = 0;
    s.routine.arguments = NULL;   
    s.routine.name = NULL;
    s.routine.isNative = 0;

    if(compiler->indentLevel > 0){
        printf(line_error("Routines can only be declared in top level indent!"), presentLine());
        he++;
    }

    if(match(TOKEN_FOREIGN))
        s.routine.isNative = 1;
    
    s.routine.name = stringOf(consume(TOKEN_IDENTIFIER, "Expected routine name!"));
    consume(TOKEN_LEFT_PAREN, "Expected '(' after routine declaration!");
    if(peek() != TOKEN_RIGHT_PAREN){
        do{
            s.routine.arity++;
            s.routine.arguments = (char **)reallocate(s.routine.arguments, sizeof(char *) * s.routine.arity);
            s.routine.arguments[s.routine.arity - 1] = stringOf(consume(TOKEN_IDENTIFIER, "Expected identifer as argument!"));
        } while(match(TOKEN_COMMA));
        consume(TOKEN_RIGHT_PAREN, "Expected ')' after argument declaration!");
    }
    else
        advance();
    consume(TOKEN_NEWLINE, "Expected newline after routine declaration!");

    if(s.routine.isNative == 0){
        s.routine.code = blockStatement(compiler, BLOCK_FUNC);

        consume(TOKEN_ENDROUTINE, "Expected EndRoutine after routine definition!");
        consume(TOKEN_NEWLINE, "Expected newline after routine definition!");
    }
    return s;
}